

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_0,_13,_2,_4>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  VecAccess<float,_4,_3> local_a8;
  undefined1 local_7c [80];
  Vec4 local_2c;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *evalCtx_local;
  
  local_10 = evalCtx;
  getInputValue<0,13>((Mat4 *)(local_7c + 0x10),(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,
                      in_ECX);
  getInputValue<2,4>((ShaderEvalContext *)local_7c,(int)local_10);
  tcu::operator*((tcu *)&local_2c,(Matrix<float,_4,_4> *)(local_7c + 0x10),
                 (Vector<float,_4> *)local_7c);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)&local_1c,&local_2c);
  tcu::Vector<float,_4>::xyz(&local_a8,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_a8,&local_1c);
  tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)(local_7c + 0x10));
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}